

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O1

GLuint __thiscall rengine::OpenGLRenderer::TexturePool::acquire(TexturePool *this)

{
  pointer puVar1;
  GLuint local_c [2];
  GLuint id;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start == puVar1) {
    glGenTextures(1,local_c);
  }
  else {
    local_c[0] = puVar1[-1];
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1 + -1;
  }
  return local_c[0];
}

Assistant:

GLuint acquire() {
            GLuint id;
            if (empty()) {
                glGenTextures(1, &id);
                return id;
            }
            id = back();
            pop_back();
            return id;
        }